

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O0

void __thiscall testing::internal::ExpectationBase::CheckActionCountIfNotDone(ExpectationBase *this)

{
  size_type sVar1;
  ostream *poVar2;
  char *pcVar3;
  ExpectationBase *in_RDI;
  stringstream ss;
  bool too_many;
  int lower_bound;
  int upper_bound;
  int action_count;
  MutexLock l;
  bool should_check;
  MutexBase *in_stack_fffffffffffffda8;
  Cardinality *in_stack_fffffffffffffdb0;
  ostream *in_stack_fffffffffffffdf8;
  ExpectationBase *in_stack_fffffffffffffe00;
  int stack_frames_to_skip;
  string local_1e0 [4];
  LogSeverity in_stack_fffffffffffffe24;
  stringstream local_1b0 [16];
  ostream local_1a0 [379];
  byte local_25;
  int local_24;
  int local_20;
  int local_1c;
  byte local_9;
  
  local_9 = 0;
  GTestMutexLock::GTestMutexLock
            ((GTestMutexLock *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  if ((in_RDI->action_count_checked_ & 1U) == 0) {
    in_RDI->action_count_checked_ = true;
    local_9 = 1;
  }
  GTestMutexLock::~GTestMutexLock((GTestMutexLock *)0x1116557);
  if (((local_9 & 1) != 0) && ((in_RDI->cardinality_specified_ & 1U) != 0)) {
    sVar1 = std::vector<const_void_*,_std::allocator<const_void_*>_>::size
                      (&in_RDI->untyped_actions_);
    local_1c = (int)sVar1;
    cardinality(in_RDI);
    local_20 = Cardinality::ConservativeUpperBound((Cardinality *)0x111659f);
    cardinality(in_RDI);
    local_24 = Cardinality::ConservativeLowerBound((Cardinality *)0x11165b8);
    if ((local_20 < local_1c) ||
       ((local_1c == local_20 && ((in_RDI->repeated_action_specified_ & 1U) != 0)))) {
      local_25 = 1;
    }
    else {
      if (local_1c < 1) {
        return;
      }
      if (local_24 <= local_1c) {
        return;
      }
      if ((in_RDI->repeated_action_specified_ & 1U) != 0) {
        return;
      }
      local_25 = 0;
    }
    std::__cxx11::stringstream::stringstream(local_1b0);
    stack_frames_to_skip = 0;
    if (&stack0x00000000 != (undefined1 *)0x1b0) {
      stack_frames_to_skip = (int)((ulong)local_1a0 >> 0x20);
    }
    DescribeLocationTo(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    poVar2 = std::operator<<(local_1a0,"Too ");
    pcVar3 = "few";
    if ((local_25 & 1) != 0) {
      pcVar3 = "many";
    }
    poVar2 = std::operator<<(poVar2,pcVar3);
    poVar2 = std::operator<<(poVar2," actions specified in ");
    pcVar3 = source_text((ExpectationBase *)0x11166df);
    poVar2 = std::operator<<(poVar2,pcVar3);
    poVar2 = std::operator<<(poVar2,"...\n");
    std::operator<<(poVar2,"Expected to be ");
    cardinality(in_RDI);
    Cardinality::DescribeTo(in_stack_fffffffffffffdb0,(ostream *)in_stack_fffffffffffffda8);
    poVar2 = std::operator<<(local_1a0,", but has ");
    pcVar3 = "only ";
    if ((local_25 & 1) != 0) {
      pcVar3 = "";
    }
    poVar2 = std::operator<<(poVar2,pcVar3);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_1c);
    poVar2 = std::operator<<(poVar2," WillOnce()");
    pcVar3 = "s";
    if (local_1c == 1) {
      pcVar3 = "";
    }
    std::operator<<(poVar2,pcVar3);
    if ((in_RDI->repeated_action_specified_ & 1U) != 0) {
      std::operator<<(local_1a0," and a WillRepeatedly()");
    }
    std::operator<<(local_1a0,".");
    std::__cxx11::stringstream::str();
    Log(in_stack_fffffffffffffe24,(string *)in_RDI,stack_frames_to_skip);
    std::__cxx11::string::~string(local_1e0);
    std::__cxx11::stringstream::~stringstream(local_1b0);
  }
  return;
}

Assistant:

GTEST_LOCK_EXCLUDED_(mutex_) {
  bool should_check = false;
  {
    MutexLock l(&mutex_);
    if (!action_count_checked_) {
      action_count_checked_ = true;
      should_check = true;
    }
  }

  if (should_check) {
    if (!cardinality_specified_) {
      // The cardinality was inferred - no need to check the action
      // count against it.
      return;
    }

    // The cardinality was explicitly specified.
    const int action_count = static_cast<int>(untyped_actions_.size());
    const int upper_bound = cardinality().ConservativeUpperBound();
    const int lower_bound = cardinality().ConservativeLowerBound();
    bool too_many;  // True if there are too many actions, or false
    // if there are too few.
    if (action_count > upper_bound ||
        (action_count == upper_bound && repeated_action_specified_)) {
      too_many = true;
    } else if (0 < action_count && action_count < lower_bound &&
               !repeated_action_specified_) {
      too_many = false;
    } else {
      return;
    }

    ::std::stringstream ss;
    DescribeLocationTo(&ss);
    ss << "Too " << (too_many ? "many" : "few") << " actions specified in "
       << source_text() << "...\n"
       << "Expected to be ";
    cardinality().DescribeTo(&ss);
    ss << ", but has " << (too_many ? "" : "only ") << action_count
       << " WillOnce()" << (action_count == 1 ? "" : "s");
    if (repeated_action_specified_) {
      ss << " and a WillRepeatedly()";
    }
    ss << ".";
    Log(kWarning, ss.str(), -1);  // -1 means "don't print stack trace".
  }
}